

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

string * google::protobuf::compiler::python::anon_unknown_0::ModuleAlias
                   (string *__return_storage_ptr__,string *filename)

{
  allocator local_52;
  allocator local_51;
  string local_50;
  string local_30;
  
  ModuleName(__return_storage_ptr__,filename);
  std::__cxx11::string::string((string *)&local_30,"_",&local_51);
  std::__cxx11::string::string((string *)&local_50,"__",&local_52);
  GlobalReplaceSubstring(&local_30,&local_50,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_30,".",&local_51);
  std::__cxx11::string::string((string *)&local_50,"_dot_",&local_52);
  GlobalReplaceSubstring(&local_30,&local_50,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string ModuleAlias(const std::string& filename) {
  std::string module_name = ModuleName(filename);
  // We can't have dots in the module name, so we replace each with _dot_.
  // But that could lead to a collision between a.b and a_dot_b, so we also
  // duplicate each underscore.
  GlobalReplaceSubstring("_", "__", &module_name);
  GlobalReplaceSubstring(".", "_dot_", &module_name);
  return module_name;
}